

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_motion.c
# Opt level: O3

int av1_hash_is_vertical_perfect(YV12_BUFFER_CONFIG *picture,int block_size,int x_start,int y_start)

{
  int iVar1;
  uint8_t *puVar2;
  long lVar3;
  short *psVar4;
  long lVar5;
  uint8_t *puVar6;
  long lVar7;
  ulong uVar8;
  uint8_t *puVar9;
  short *psVar10;
  
  iVar1 = (picture->field_4).field_0.y_stride;
  lVar5 = (long)iVar1;
  lVar7 = (long)(y_start * iVar1);
  puVar2 = (picture->field_5).buffers[0] + lVar7 + x_start;
  if ((picture->flags & 8) == 0) {
    if (0 < block_size) {
      puVar6 = (picture->field_5).buffers[0] + lVar7 + x_start + lVar5;
      uVar8 = 0;
      do {
        if (block_size != 1) {
          lVar7 = (ulong)(uint)block_size - 1;
          puVar9 = puVar6;
          do {
            if (*puVar9 != puVar2[uVar8]) {
              return 0;
            }
            puVar9 = puVar9 + lVar5;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        uVar8 = uVar8 + 1;
        puVar6 = puVar6 + 1;
      } while (uVar8 != (uint)block_size);
    }
  }
  else if (0 < block_size) {
    lVar7 = (long)puVar2 * 2;
    psVar4 = (short *)(lVar7 + lVar5 * 2);
    uVar8 = 0;
    do {
      if (block_size != 1) {
        lVar3 = (ulong)(uint)block_size - 1;
        psVar10 = psVar4;
        do {
          if (*psVar10 != *(short *)(lVar7 + uVar8 * 2)) {
            return 0;
          }
          psVar10 = psVar10 + lVar5;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
      uVar8 = uVar8 + 1;
      psVar4 = psVar4 + 1;
    } while (uVar8 != (uint)block_size);
  }
  return 1;
}

Assistant:

int av1_hash_is_vertical_perfect(const YV12_BUFFER_CONFIG *picture,
                                 int block_size, int x_start, int y_start) {
  const int stride = picture->y_stride;
  const uint8_t *p = picture->y_buffer + y_start * stride + x_start;

  if (picture->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *p16 = CONVERT_TO_SHORTPTR(p);
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p16[j * stride + i] != p16[i]) {
          return 0;
        }
      }
    }
  } else {
    for (int i = 0; i < block_size; i++) {
      for (int j = 1; j < block_size; j++) {
        if (p[j * stride + i] != p[i]) {
          return 0;
        }
      }
    }
  }
  return 1;
}